

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

Iterator __thiscall
axl::sl::
ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
::insertTail(ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
             *this,Point2d *p)

{
  size_t *psVar1;
  Point2d *pPVar2;
  ListLink *link;
  
  pPVar2 = (this->super_ListData<Point2d>).m_tail;
  (p->super_ListLink).m_next = (ListLink *)0x0;
  (p->super_ListLink).m_prev = &pPVar2->super_ListLink;
  if (pPVar2 == (Point2d *)0x0) {
    pPVar2 = (Point2d *)this;
  }
  (pPVar2->super_ListLink).m_next = &p->super_ListLink;
  (this->super_ListData<Point2d>).m_tail = p;
  psVar1 = &(this->super_ListData<Point2d>).m_count;
  *psVar1 = *psVar1 + 1;
  return (IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
          )(IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
            )p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}